

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::UpsampleLayerParams::ByteSizeLong(UpsampleLayerParams *this)

{
  int iVar1;
  long lVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int index;
  
  iVar1 = (this->scalingfactor_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->scalingfactor_,index);
      lVar2 = 0x3f;
      if ((*puVar3 | 1) != 0) {
        for (; (*puVar3 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar6 = (uint)lVar7;
  if (lVar7 == 0) {
    uVar5 = 0;
  }
  else if ((int)uVar6 < 0) {
    uVar5 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_scalingfactor_cached_byte_size_ = uVar6;
  lVar7 = uVar5 + lVar7;
  uVar5 = (ulong)(uint)(this->fractionalscalingfactor_).current_size_;
  lVar2 = uVar5 * 4;
  uVar6 = (uint)lVar2;
  if (uVar5 != 0) {
    if ((int)uVar6 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar7 = lVar7 + uVar5;
  }
  this->_fractionalscalingfactor_cached_byte_size_ = uVar6;
  sVar4 = lVar7 + lVar2;
  uVar6 = this->mode_;
  if (uVar6 != 0) {
    if ((int)uVar6 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar5;
  }
  uVar6 = this->linearupsamplemode_;
  if (uVar6 != 0) {
    if ((int)uVar6 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar5;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t UpsampleLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UpsampleLayerParams)
  size_t total_size = 0;

  // repeated uint64 scalingFactor = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->scalingfactor_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _scalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float fractionalScalingFactor = 7;
  {
    unsigned int count = this->fractionalscalingfactor_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _fractionalscalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.UpsampleLayerParams.InterpolationMode mode = 5;
  if (this->mode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->mode());
  }

  // .CoreML.Specification.UpsampleLayerParams.LinearUpsampleMode linearUpsampleMode = 6;
  if (this->linearupsamplemode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->linearupsamplemode());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}